

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::operator()(Builder *this,VarDeclStmt *node)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  BuilderContext *pBVar1;
  BuilderContext *id;
  bool bVar2;
  FunctionModule *this_01;
  element_type *peVar3;
  element_type *node_00;
  ASTNode *pAVar4;
  byte local_199;
  allocator<char> local_169;
  string local_168 [32];
  shared_ptr<mocker::ir::Reg> local_148;
  string local_138 [32];
  shared_ptr<mocker::ir::Reg> local_118;
  undefined4 local_104;
  undefined1 local_100 [48];
  shared_ptr<mocker::ir::Reg> local_d0;
  byte local_b9;
  undefined1 local_b8 [32];
  shared_ptr<mocker::ir::IRInst> local_98;
  BBLIter local_88;
  string local_70 [32];
  undefined1 local_50 [8];
  shared_ptr<mocker::ir::Reg> valPtr;
  string name;
  FunctionModule *func;
  VarDeclStmt *node_local;
  Builder *this_local;
  
  this_01 = BuilderContext::getCurFunc(this->ctx);
  peVar3 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&node->identifier);
  this_00 = &valPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::string((string *)this_00,(string *)&peVar3->val);
  std::__cxx11::string::string(local_70,(string *)this_00);
  makeReg((Builder *)local_50,(string *)this);
  std::__cxx11::string::~string(local_70);
  pBVar1 = this->ctx;
  local_88 = FunctionModule::getFirstBB(this_01);
  std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
            ((shared_ptr<mocker::ir::Reg> *)(local_b8 + 0x10));
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Alloca,void>
            (&local_98,(shared_ptr<mocker::ir::Alloca> *)(local_b8 + 0x10));
  BuilderContext::appendInstFront(pBVar1,local_88,&local_98);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_98);
  std::shared_ptr<mocker::ir::Alloca>::~shared_ptr
            ((shared_ptr<mocker::ir::Alloca> *)(local_b8 + 0x10));
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->initExpr);
  local_b9 = 0;
  local_199 = 0;
  if (bVar2) {
    pBVar1 = this->ctx;
    pAVar4 = &std::
              __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&node->initExpr)->super_ASTNode;
    ast::ASTNode::getID(pAVar4);
    BuilderContext::getExprType((BuilderContext *)local_b8,(NodeID)pBVar1);
    local_b9 = 1;
    bVar2 = isNullTy(this,(shared_ptr<mocker::ast::Type> *)local_b8);
    local_199 = bVar2 ^ 0xff;
  }
  if ((local_b9 & 1) != 0) {
    std::shared_ptr<mocker::ast::Type>::~shared_ptr((shared_ptr<mocker::ast::Type> *)local_b8);
  }
  if ((local_199 & 1) == 0) {
    bVar2 = isBoolTy(this,&node->type);
    if ((bVar2) || (bVar2 = isIntTy(this,&node->type), bVar2)) {
      local_104 = 1;
    }
    else {
      pBVar1 = this->ctx;
      std::__cxx11::string::string
                (local_138,
                 (string *)
                 &valPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      makeReg((Builder *)&local_118,(string *)this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_168,"@null",&local_169);
      makeReg((Builder *)&local_148,(string *)this);
      BuilderContext::
      emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>>
                (pBVar1,&local_118,&local_148);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_148);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator(&local_169);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_118);
      std::__cxx11::string::~string(local_138);
      local_104 = 0;
    }
  }
  else {
    node_00 = std::
              __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&node->initExpr);
    visit<mocker::ast::Expression>(this,node_00);
    pBVar1 = this->ctx;
    std::__cxx11::string::string
              ((string *)(local_100 + 0x10),
               (string *)
               &valPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    makeReg((Builder *)&local_d0,(string *)this);
    id = this->ctx;
    pAVar4 = &std::
              __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&node->initExpr)->super_ASTNode;
    ast::ASTNode::getID(pAVar4);
    BuilderContext::getExprAddr((BuilderContext *)local_100,(NodeID)id);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Addr>>
              (pBVar1,&local_d0,(shared_ptr<mocker::ir::Addr> *)local_100);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_100);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_d0);
    std::__cxx11::string::~string((string *)(local_100 + 0x10));
    local_104 = 1;
  }
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_50);
  std::__cxx11::string::~string
            ((string *)
             &valPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Builder::operator()(const ast::VarDeclStmt &node) const {
  auto &func = ctx.getCurFunc();
  auto name = node.identifier->val;
  auto valPtr = makeReg(name);
  ctx.appendInstFront(func.getFirstBB(), std::make_shared<Alloca>(valPtr));

  if (node.initExpr && !isNullTy(ctx.getExprType(node.initExpr->getID()))) {
    visit(*node.initExpr);
    ctx.emplaceInst<Store>(makeReg(name),
                           ctx.getExprAddr(node.initExpr->getID()));
    return;
  }
  if (isBoolTy(node.type) || isIntTy(node.type)) {
    return;
  }
  ctx.emplaceInst<Store>(makeReg(name), makeReg("@null"));
}